

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

Status __thiscall
google::protobuf::compiler::java::ValidateNestInFileClassFeature
          (java *this,EnumDescriptor *descriptor)

{
  char *pcVar1;
  ConstType pJVar2;
  string_view message;
  string local_90;
  AlphaNum local_70;
  string_view local_40 [3];
  
  if ((descriptor->containing_type_ != (Descriptor *)0x0) &&
     (pJVar2 = protobuf::internal::InternalFeatureHelper::
               GetUnresolvedFeatures<google::protobuf::EnumDescriptor,google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,(unsigned_char)11,false>
                         (descriptor,
                          (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
                           *)pb::java),
     (undefined1  [20])((undefined1  [20])pJVar2->field_0 & (undefined1  [20])0x10) !=
     (undefined1  [20])0x0)) {
    local_40[0] = absl::lts_20250127::NullSafeStringView
                            (
                            "Feature pb.java.nest_in_file_class only applies to top-level types and is not allowed to be set on the nested type: "
                            );
    pcVar1 = (descriptor->all_names_).payload_;
    local_70.piece_._M_len = (size_t)*(ushort *)(pcVar1 + 2);
    local_70.piece_._M_str = pcVar1 + ~local_70.piece_._M_len;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_90,(lts_20250127 *)local_40,&local_70,(AlphaNum *)local_70.piece_._M_str);
    message._M_str = (char *)local_90._M_string_length;
    message._M_len = (size_t)this;
    absl::lts_20250127::FailedPreconditionError(message);
    std::__cxx11::string::~string((string *)&local_90);
    return (Status)(uintptr_t)this;
  }
  *(undefined8 *)this = 1;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateNestInFileClassFeature(const EnumDescriptor& descriptor) {
  return ValidateNestInFileClassFeatureHelper(descriptor);
}